

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

bool __thiscall
slang::ast::ValueExpressionBase::requireLValueImpl
          (ValueExpressionBase *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix,
          EvalContext *customEvalContext)

{
  SymbolKind SVar1;
  ValueSymbol *context_00;
  SourceRange varRange;
  bool bVar2;
  uint uVar3;
  SourceLocation in_RAX;
  Diagnostic *pDVar4;
  Type *this_00;
  SourceLocation SVar5;
  SourceLocation unaff_RBX;
  DiagCode code;
  SourceRange sourceRange;
  SourceLocation SVar6;
  
  if (((ulong)location & 0xfffffff) == 0) {
    location = (this->super_Expression).sourceRange.startLoc;
  }
  SVar1 = (this->symbol->super_Symbol).kind;
  uVar3 = SVar1 - EnumValue;
  if ((uVar3 < 0x3f) && ((0x4000000008000001U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
    pDVar4 = ASTContext::addDiag(context,(DiagCode)0x340007,location);
    pDVar4 = Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
    Diagnostic::addNote(pDVar4,(DiagCode)0x40001,(this->symbol->super_Symbol).location);
    Diagnostic::operator<<(pDVar4,(this->super_Expression).sourceRange);
    return false;
  }
  if (((context->flags).m_bits & 0x80) == 0) {
    if (SVar1 != Net) {
LAB_003a0bfa:
      context_00 = this->symbol;
      uVar3 = (context_00->super_Symbol).kind - 0x2b;
      if (uVar3 < 0x28) {
        if ((0xc006078000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          if (((ulong)uVar3 == 0) && (context_00[1].super_Symbol.kind == 0)) {
            pDVar4 = ASTContext::addDiag(context,(DiagCode)0x520007,
                                         (this->super_Expression).sourceRange);
            Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
            Diagnostic::addNote(pDVar4,(DiagCode)0x40001,(this->symbol->super_Symbol).location);
            return false;
          }
        }
        else {
          varRange.endLoc = unaff_RBX;
          varRange.startLoc = in_RAX;
          bVar2 = checkVariableAssignment
                            ((ValueExpressionBase *)context,(ASTContext *)context_00,
                             (VariableSymbol *)(ulong)flags.m_bits,
                             (bitmask<slang::ast::AssignFlags>)location._0_4_,
                             (this->super_Expression).sourceRange.startLoc,varRange);
          if (!bVar2) {
            return false;
          }
        }
      }
      if (longestStaticPrefix == (Expression *)0x0) {
        longestStaticPrefix = &this->super_Expression;
      }
      ASTContext::addDriver(context,this->symbol,longestStaticPrefix,flags,customEvalContext);
      return true;
    }
    SVar6 = (this->super_Expression).sourceRange.startLoc;
    SVar5 = (this->super_Expression).sourceRange.endLoc;
    code.subsystem = Expressions;
    code.code = 10;
  }
  else {
    this_00 = DeclaredType::getType(&this->symbol->declaredType);
    if (this_00->canonical == (Type *)0x0) {
      Type::resolveCanonical(this_00);
    }
    if ((this_00->canonical->super_Symbol).kind != CHandleType) {
      in_RAX = (SourceLocation)customEvalContext;
      if (((this->symbol->super_Symbol).kind == Net) &&
         (((byte)((flags.m_bits & 0x10) >> 4) &
          *(int *)(*(long *)&this->symbol[1].super_Symbol + 0x80) == 0xc) == 1)) {
        pDVar4 = ASTContext::addDiag(context,(DiagCode)0x4e0007,(this->super_Expression).sourceRange
                                    );
        Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
        return false;
      }
      goto LAB_003a0bfa;
    }
    SVar6 = (this->super_Expression).sourceRange.startLoc;
    SVar5 = (this->super_Expression).sourceRange.endLoc;
    code.subsystem = Expressions;
    code.code = 9;
  }
  sourceRange.endLoc = SVar5;
  sourceRange.startLoc = SVar6;
  ASTContext::addDiag(context,code,sourceRange);
  return false;
}

Assistant:

bool ValueExpressionBase::requireLValueImpl(const ASTContext& context, SourceLocation location,
                                            bitmask<AssignFlags> flags,
                                            const Expression* longestStaticPrefix,
                                            EvalContext* customEvalContext) const {
    if (!location)
        location = sourceRange.start();

    if (symbol.kind == SymbolKind::Parameter || symbol.kind == SymbolKind::EnumValue ||
        symbol.kind == SymbolKind::Specparam) {
        auto& diag = context.addDiag(diag::CantModifyConst, location) << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        diag << sourceRange;
        return false;
    }

    if (context.flags.has(ASTFlags::NonProcedural)) {
        // chandles can only be assigned in procedural contexts.
        if (symbol.getType().isCHandle()) {
            context.addDiag(diag::AssignToCHandle, sourceRange);
            return false;
        }

        if (symbol.kind == SymbolKind::Net &&
            symbol.as<NetSymbol>().netType.netKind == NetType::UWire &&
            flags.has(AssignFlags::InOutPort)) {
            context.addDiag(diag::InOutUWireConn, sourceRange) << symbol.name;
            return false;
        }
    }
    else {
        // Nets can't be assigned in procedural contexts.
        if (symbol.kind == SymbolKind::Net) {
            context.addDiag(diag::AssignToNet, sourceRange);
            return false;
        }
    }

    if (VariableSymbol::isKind(symbol.kind)) {
        if (!checkVariableAssignment(context, symbol.as<VariableSymbol>(), flags, location,
                                     sourceRange)) {
            return false;
        }
    }
    else if (symbol.kind == SymbolKind::ModportPort) {
        if (symbol.as<ModportPortSymbol>().direction == ArgumentDirection::In) {
            auto& diag = context.addDiag(diag::InputPortAssign, sourceRange);
            diag << symbol.name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
            return false;
        }
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;
    context.addDriver(symbol, *longestStaticPrefix, flags, customEvalContext);

    return true;
}